

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

bool __thiscall
wasm::SimplifyLocals<true,_false,_true>::canSink
          (SimplifyLocals<true,_false,_true> *this,LocalSet *set)

{
  Module *module;
  bool bVar1;
  EffectAnalyzer local_198;
  
  bVar1 = LocalSet::isTee(set);
  if (!bVar1) {
    module = (this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .currModule;
    if (((module->features).features & 0x40) != 0) {
      EffectAnalyzer::EffectAnalyzer
                (&local_198,
                 &((this->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                   ).super_Pass.runner)->options,module,set->value);
      EffectAnalyzer::~EffectAnalyzer(&local_198);
      if (local_198.danglingPop != false) {
        return false;
      }
    }
    if ((this->firstCycle != true) ||
       ((this->getCounter).num.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[set->index] < 2)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool canSink(LocalSet* set) {
    // we can never move a tee
    if (set->isTee()) {
      return false;
    }
    // We cannot move expressions containing pops that are not enclosed in
    // 'catch', because 'pop' should follow right after 'catch'.
    FeatureSet features = this->getModule()->features;
    if (features.hasExceptionHandling() &&
        EffectAnalyzer(this->getPassOptions(), *this->getModule(), set->value)
          .danglingPop) {
      return false;
    }
    // if in the first cycle, or not allowing tees, then we cannot sink if >1
    // use as that would make a tee
    if ((firstCycle || !allowTee) && getCounter.num[set->index] > 1) {
      return false;
    }
    return true;
  }